

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubytearray.h
# Opt level: O3

UByteArray * __thiscall UByteArray::toHex(UByteArray *__return_storage_ptr__,UByteArray *this)

{
  byte bVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hex;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct
            ((ulong)&local_38,(char)(int)(this->d)._M_string_length * '\x02');
  if (0 < (int)(this->d)._M_string_length) {
    lVar2 = 0;
    do {
      bVar1 = (this->d)._M_dataplus._M_p[lVar2];
      cVar4 = '0';
      cVar3 = '0';
      if (9 < (bVar1 & 0xf)) {
        cVar3 = 'W';
      }
      if (0x9f < bVar1) {
        cVar4 = 'W';
      }
      local_38[lVar2 * 2] = cVar4 + (bVar1 >> 4);
      local_38[lVar2 * 2 + 1] = cVar3 + (bVar1 & 0xf);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (int)(this->d)._M_string_length);
  }
  (__return_storage_ptr__->d)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->d).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

UByteArray toHex() {
        std::basic_string<char> hex(size() * 2, '\x00');
        for (int32_t i = 0; i < size(); i++) {
            uint8_t low  = d[i] & 0x0F;
            uint8_t high = (d[i] & 0xF0) >> 4;
            low += (low < 10 ? '0' : 'a' - 10);
            high += (high < 10 ? '0' : 'a' - 10);
            hex[2*i] = high;
            hex[2*i + 1] = low;
        }
        return UByteArray(hex);
    }